

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void proto2_unittest::TestJsonName::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      *(int *)&to_msg[1]._internal_metadata_.ptr_ = (int)from_msg[1]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&to_msg[1]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 4) != 0) {
      *(undefined4 *)&to_msg[2]._vptr_MessageLite = *(undefined4 *)&from_msg[2]._vptr_MessageLite;
    }
    if ((uVar1 & 8) != 0) {
      *(undefined4 *)((long)&to_msg[2]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[2]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 0x10) != 0) {
      *(int *)&to_msg[2]._internal_metadata_.ptr_ = (int)from_msg[2]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined4 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 0x40) != 0) {
      *(undefined4 *)&to_msg[3]._vptr_MessageLite = *(undefined4 *)&from_msg[3]._vptr_MessageLite;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestJsonName::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestJsonName*>(&to_msg);
  auto& from = static_cast<const TestJsonName&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestJsonName)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.field_name1_ = from._impl_.field_name1_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.fieldname2_ = from._impl_.fieldname2_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.fieldname3_ = from._impl_.fieldname3_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_._field_name4_ = from._impl_._field_name4_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.field_name5_ = from._impl_.field_name5_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.field_name6_ = from._impl_.field_name6_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.fieldname7_ = from._impl_.fieldname7_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}